

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O3

drwav_uint64 drwav_write(drwav *pWav,drwav_uint64 samplesToWrite,void *pData)

{
  size_t sVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (pData == (void *)0x0 || (samplesToWrite == 0 || pWav == (drwav *)0x0)) {
    return 0;
  }
  uVar3 = (ulong)pWav->bitsPerSample;
  if (samplesToWrite * uVar3 < 8) {
    uVar2 = 0;
  }
  else {
    sVar1 = (*pWav->onWrite)(pWav->pUserData,pData,samplesToWrite * uVar3 >> 3);
    pWav->dataChunkDataSize = pWav->dataChunkDataSize + sVar1;
    uVar2 = sVar1 << 3;
    uVar3 = (ulong)pWav->bitsPerSample;
  }
  return uVar2 / uVar3;
}

Assistant:

drwav_uint64 drwav_write(drwav* pWav, drwav_uint64 samplesToWrite, const void* pData) {
    if (pWav == NULL || samplesToWrite == 0 || pData == NULL) {
        return 0;
    }

    drwav_uint64 bytesToWrite = ((samplesToWrite * pWav->bitsPerSample) / 8);
    if (bytesToWrite > SIZE_MAX) {
        return 0;
    }

    size_t bytesWritten = drwav_write_raw(pWav, (size_t)bytesToWrite, pData);
    return ((drwav_uint64)bytesWritten * 8) / pWav->bitsPerSample;
}